

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O3

void __thiscall FileReceiveSession::FileReceiveSession(FileReceiveSession *this,path *file)

{
  pointer pcVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"FileReceiveSession","");
  Subscriber::Subscriber(&this->super_Subscriber,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_0014bbe8;
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream(&this->stream);
  (this->file).m_pathname._M_dataplus._M_p = (pointer)&(this->file).m_pathname.field_2;
  pcVar1 = (file->m_pathname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file,pcVar1,pcVar1 + (file->m_pathname)._M_string_length);
  (this->fail).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fail)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fail).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fail).super__Function_base._M_functor + 8) = 0;
  (this->success).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->success)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->success).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->success).super__Function_base._M_functor + 8) = 0;
  Subscriber::set_expected(&this->super_Subscriber,1);
  std::fstream::open((char *)&this->stream,(_Ios_Openmode)(file->m_pathname)._M_dataplus._M_p);
  return;
}

Assistant:

FileReceiveSession::FileReceiveSession(const fs::path &file) :
    Subscriber("FileReceiveSession"), stream(), file(file) {
  set_expected(POLLIN);
  stream.open(file, std::ios::out);
}